

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  anon_struct_80_3_b6d6cd30 *paVar1;
  
  paVar1 = this->d->params + id;
  paVar1->type = 4;
  Mat::operator=(&paVar1->v,v);
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    d->params[id].type = 4;
    d->params[id].v = v;
}